

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall
djb::matrix::transform
          (matrix *this,vector<double,_std::allocator<double>_> *v,
          vector<double,_std::allocator<double>_> *out)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double local_30;
  
  std::vector<double,_std::allocator<double>_>::resize(out,0);
  iVar4 = this->size;
  for (lVar6 = 0; lVar6 < iVar4; lVar6 = lVar6 + 1) {
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(out,&local_30);
    iVar4 = this->size;
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->mij).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
      pdVar2[lVar6] = pdVar3[iVar4 * (int)lVar6 + lVar5] * pdVar1[lVar5] + pdVar2[lVar6];
    }
  }
  return;
}

Assistant:

void
matrix::transform(const std::vector<double> &v, std::vector<double> &out) const
{
	out.resize(0);

	for (int j = 0; j < size; ++j) {
		out.push_back(0);

		for (int i = 0; i < size; ++i) {
			out[j]+= (*this)(i, j) * v[i];
		}
	}
}